

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.cpp
# Opt level: O0

void __thiscall GdlPass::ClearFsmWorkSpace(GdlPass *this)

{
  bool bVar1;
  pointer ppVar2;
  size_type_conflict sVar3;
  reference ppFVar4;
  long in_RDI;
  size_t i;
  iterator hmit;
  map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>
  *in_stack_ffffffffffffffc0;
  FsmMachineClass *this_00;
  vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *this_01;
  ulong local_20;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>
                           *)0x1a9529);
    this_01 = ppVar2->second;
    if (this_01 != (vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)0x0) {
      std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::~vector(this_01);
      operator_delete(this_01,0x18);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>
    ::operator++(in_stack_ffffffffffffffc0);
  }
  std::
  map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
  ::clear((map<int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
           *)0x1a9570);
  local_20 = 0;
  while( true ) {
    sVar3 = std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::size
                      ((vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)
                       (in_RDI + 0xe8));
    if (sVar3 <= local_20) break;
    ppFVar4 = std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::operator[]
                        ((vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)
                         (in_RDI + 0xe8),local_20);
    this_00 = *ppFVar4;
    if (this_00 != (FsmMachineClass *)0x0) {
      FsmMachineClass::~FsmMachineClass(this_00);
      operator_delete(this_00,0x78);
    }
    local_20 = local_20 + 1;
  }
  std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::clear
            ((vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)0x1a9601);
  return;
}

Assistant:

void GdlPass::ClearFsmWorkSpace()
{
	//	Delete all the machine-class lists in the hash map.
	for (std::map<int, MachineClassList>::iterator hmit = m_hmMachineClassMap.begin();
		hmit != m_hmMachineClassMap.end();
		++hmit)
	{
		delete hmit->second;	// vector containing a group of machine classes with the same key;
								// notice that we store a pointer to the vector which is separately
								// allocated, not the vector itself, due to the limitations of the
								// previous HashMap implementation.
	}
	m_hmMachineClassMap.clear();

	//	Delete all the FsmMachineClasses and clear the master list.
	for (size_t i = 0; i < m_vpfsmc.size(); i++)
		delete m_vpfsmc[i];
	m_vpfsmc.clear();
}